

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketnonblocking.cpp
# Opt level: O1

ssize_t __thiscall
hbm::SocketNonblocking::receiveComplete(SocketNonblocking *this,void *pBlock,size_t size)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  size_t __n;
  int in_R8D;
  pollfd pfd;
  pollfd local_38;
  
  if (size != 0) {
    __n = size;
    do {
      sVar2 = BufferedReader::recv(&this->m_bufferedReader,this->m_fd,pBlock,__n,in_R8D);
      if (sVar2 < 1) {
        if (sVar2 == 0) {
          return size - __n;
        }
        piVar3 = __errno_location();
        if (*piVar3 != 0xb) {
          return -1;
        }
        local_38.fd = this->m_fd;
        local_38.events = 1;
        do {
          iVar1 = poll(&local_38,1,-1);
          if (iVar1 != -1) break;
        } while (*piVar3 == 4);
        if (iVar1 != 1) {
          return -1;
        }
      }
      else {
        __n = __n - sVar2;
        pBlock = (void *)((long)pBlock + sVar2);
      }
    } while (__n != 0);
  }
  return size;
}

Assistant:

ssize_t hbm::SocketNonblocking::receiveComplete(void* pBlock, size_t size)
{
	ssize_t retVal;
	unsigned char* pPos = reinterpret_cast < unsigned char* > (pBlock);
	size_t sizeLeft = size;
	while(sizeLeft) {
		retVal = m_bufferedReader.recv(m_fd, pPos, sizeLeft);
		if(retVal>0) {
			sizeLeft -= retVal;
			pPos += retVal;
		} else if(retVal==0) {
			return size-sizeLeft;
		} else {
			if(errno==EWOULDBLOCK || errno==EAGAIN) {
				// wait for socket to become readable.
				struct pollfd pfd;
				pfd.fd = m_fd;
				pfd.events = POLLIN;
				int nfds;
				do {
					nfds = poll(&pfd, 1, -1);
				} while((nfds==-1) && (errno==EINTR));
				if(nfds!=1) {
					return -1;
				}
			} else {
				return -1;
			}
		}
	}
	return size;
}